

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O2

void __thiscall KDIS::PDU::Record_Query_R_PDU::Record_Query_R_PDU(Record_Query_R_PDU *this)

{
  Simulation_Management_Header::Simulation_Management_Header
            (&this->super_Simulation_Management_Header);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header);
  (this->super_Simulation_Management_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Record_Query_R_PDU_00215ad8;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Record_Query_R_PDU_00215b18;
  this->m_ui32RqId = 0;
  this->m_ui16EvntTyp = 0;
  this->m_ui32Time = 0;
  this->m_ui32NumRecs = 0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vui32RecID).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = 'A';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\n';
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolVersion =
       '\x06';
  return;
}

Assistant:

Record_Query_R_PDU::Record_Query_R_PDU() :
    m_ui32RqId( 0 ),
    m_ui16EvntTyp( 0 ),
    m_ui32Time( 0 ),
    m_ui32NumRecs( 0 )
{
    m_ui8PDUType = RecordQuery_R_PDU_Type;
    m_ui16PDULength = RECORD_QUERY_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}